

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_VarArgExprPrecedence_Test::ExprWriterTest_VarArgExprPrecedence_Test
          (ExprWriterTest_VarArgExprPrecedence_Test *this)

{
  undefined8 *in_RDI;
  ExprWriterTest *in_stack_00000030;
  
  ExprWriterTest::ExprWriterTest(in_stack_00000030);
  *in_RDI = &PTR__ExprWriterTest_VarArgExprPrecedence_Test_001ed378;
  in_RDI[2] = &PTR__ExprWriterTest_VarArgExprPrecedence_Test_001ed3b8;
  return;
}

Assistant:

TEST_F(ExprWriterTest, VarArgExprPrecedence) {
  NumericExpr x1 = MakeVariable(0), x2 = MakeVariable(1);
  NumericExpr e = MakeBinary(ex::ADD, x1, x2);
  NumericExpr args[] = {e, e};
  CHECK_WRITE("min(x1 + x2, x1 + x2)", MakeIterated(ex::MIN, args));
  CHECK_WRITE("max(x1 + x2, x1 + x2)", MakeIterated(ex::MAX, args));
  NumericExpr args2[] = {x1}, args3[] = {x2};
  NumericExpr args4[] = {
    MakeIterated(ex::MIN, args2), MakeIterated(ex::MIN, args3)
  };
  CHECK_WRITE("min(min(x1), min(x2))", MakeIterated(ex::MIN, args4));
  NumericExpr args5[] = {
    MakeIterated(ex::MAX, args2), MakeIterated(ex::MAX, args3)
  };
  CHECK_WRITE("max(max(x1), max(x2))", MakeIterated(ex::MAX, args5));
}